

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentEditor.cpp
# Opt level: O1

void __thiscall
InstrumentEditor::InstrumentEditor
          (InstrumentEditor *this,Module *mod,InstrumentListModel *model,
          WaveListModel *waveListModel,PianoInput *input,QWidget *parent)

{
  Data *pDVar1;
  int *piVar2;
  uint uVar3;
  QString *data;
  QGroupBox *this_00;
  QVBoxLayout *pQVar4;
  QComboBox *pQVar5;
  QCheckBox *pQVar6;
  QGroupBox *pQVar7;
  EnvelopeForm *pEVar8;
  QHBoxLayout *pQVar9;
  QPushButton *pQVar10;
  QTabWidget *this_01;
  QWidget *pQVar11;
  SequenceEditor *pSVar12;
  undefined4 *puVar13;
  ulong uVar14;
  long lVar15;
  size_t sequenceIndex;
  QString local_e0;
  long local_c8 [2];
  qsizetype qStack_b8;
  char local_b0 [24];
  char local_98 [24];
  QArrayDataPointer<QString> local_80;
  QComboBox **local_68;
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QArrayData *d;
  
  BaseEditor::BaseEditor(&this->super_BaseEditor,&model->super_BaseTableModel,input,parent);
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog = &PTR_metaObject_001fd420;
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog.field_0x10 =
       &PTR__InstrumentEditor_001fd600;
  this->mModule = mod;
  this->mWaveListModel = waveListModel;
  this->mChannelCombo = (QComboBox *)0x0;
  this->mSetEnvelopeCheck = (QCheckBox *)0x0;
  this->mEnvelopeGroup = (QGroupBox *)0x0;
  this->mEnvelopeForm = (EnvelopeForm *)0x0;
  this->mWaveformGroup = (QGroupBox *)0x0;
  this->mWaveformCombo = (QComboBox *)0x0;
  this->mWaveformEditButton = (QPushButton *)0x0;
  this->mSequenceTabs = (QTabWidget *)0x0;
  (this->mSequenceEditors)._M_elems[0] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[1] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[2] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[3] = (SequenceEditor *)0x0;
  (this->mInstrument).super___shared_ptr<trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->mInstrument).super___shared_ptr<trackerboy::Instrument,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->mCanEdit = true;
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b5288);
  QWidget::setWindowTitle((QString *)this);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  this_00 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b529a);
  QGroupBox::QGroupBox(this_00,&local_e0,(QWidget *)0x0);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4);
  pQVar5 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar5,(QWidget *)0x0);
  local_68 = &this->mChannelCombo;
  *local_68 = pQVar5;
  pQVar6 = (QCheckBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52ff);
  QCheckBox::QCheckBox(pQVar6,&local_e0,(QWidget *)0x0);
  this->mSetEnvelopeCheck = pQVar6;
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  QBoxLayout::addWidget(pQVar4,*local_68,0);
  QBoxLayout::addWidget(pQVar4,this->mSetEnvelopeCheck,0);
  QBoxLayout::addStretch((int)pQVar4);
  QWidget::setLayout((QLayout *)this_00);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52a2);
  QGroupBox::QGroupBox(pQVar7,&local_e0,(QWidget *)0x0);
  this->mEnvelopeGroup = pQVar7;
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4);
  pEVar8 = (EnvelopeForm *)operator_new(0x140);
  EnvelopeForm::EnvelopeForm(pEVar8,(QWidget *)0x0);
  this->mEnvelopeForm = pEVar8;
  QBoxLayout::addWidget(pQVar4,pEVar8,0);
  QBoxLayout::addStretch((int)pQVar4);
  QLayout::setContentsMargins((int)pQVar4,0,0,0);
  QWidget::setLayout((QLayout *)this->mEnvelopeGroup);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52b2);
  QGroupBox::QGroupBox(pQVar7,&local_e0,(QWidget *)0x0);
  this->mWaveformGroup = pQVar7;
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar9 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar9);
  pQVar5 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar5,(QWidget *)0x0);
  this->mWaveformCombo = pQVar5;
  (**(code **)(*(long *)pQVar5 + 0x1a0))(pQVar5,this->mWaveListModel);
  pQVar10 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b5549);
  QPushButton::QPushButton(pQVar10,&local_e0,(QWidget *)0x0);
  this->mWaveformEditButton = pQVar10;
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  QPushButton::setAutoDefault(SUB81(this->mWaveformEditButton,0));
  QPushButton::setDefault(SUB81(this->mWaveformEditButton,0));
  QBoxLayout::addWidget(pQVar9,this->mWaveformCombo,1);
  QBoxLayout::addWidget(pQVar9,this->mWaveformEditButton,0);
  QLayoutItem::setAlignment(pQVar9 + 0x10,0x20);
  QWidget::setLayout((QLayout *)this->mWaveformGroup);
  this_01 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(this_01,(QWidget *)0x0);
  this->mSequenceTabs = this_01;
  pQVar4 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar4);
  pQVar9 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar9);
  QBoxLayout::addWidget(pQVar9,this_00,0);
  QBoxLayout::addWidget(pQVar9,this->mEnvelopeGroup,1);
  QBoxLayout::addWidget(pQVar9,this->mWaveformGroup,1);
  QBoxLayout::addLayout((QLayout *)pQVar4,(int)pQVar9);
  QBoxLayout::addWidget(pQVar4,this->mSequenceTabs,1);
  QLayout::setContentsMargins((int)pQVar4,0,0,0);
  pQVar11 = BaseEditor::editorWidget(&this->super_BaseEditor);
  QWidget::setLayout((QLayout *)pQVar11);
  QWidget::hide();
  QWidget::setEnabled(SUB81(this->mWaveformGroup,0));
  QWidget::setEnabled(SUB81(this->mEnvelopeGroup,0));
  pQVar5 = *local_68;
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52bb);
  QMetaObject::tr((char *)local_c8,(char *)&staticMetaObject,0x1b52c6);
  QMetaObject::tr(local_b0,(char *)&staticMetaObject,0x1b52d1);
  QMetaObject::tr(local_98,(char *)&staticMetaObject,0x1b52dc);
  local_80.ptr = (QString *)QArrayData::allocate(&d,0x18,8,4,KeepSize);
  local_80.d = (Data *)d;
  local_80.size = 0;
  uVar14 = 0xffffffffffffffe8;
  do {
    pDVar1 = *(Data **)((long)local_c8 + uVar14);
    local_80.ptr[local_80.size].d.d = pDVar1;
    local_80.ptr[local_80.size].d.ptr = *(char16_t **)((long)local_c8 + uVar14 + 8);
    local_80.ptr[local_80.size].d.size = *(qsizetype *)(local_b0 + (uVar14 - 8));
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_80.size = local_80.size + 1;
    uVar14 = uVar14 + 0x18;
  } while (uVar14 < 0x48);
  uVar3 = QComboBox::count();
  QComboBox::insertItems((int)pQVar5,(QList *)(ulong)uVar3);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_80);
  lVar15 = 0x48;
  do {
    piVar2 = *(int **)((long)&local_e0.d.d + lVar15);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        QArrayData::deallocate(*(QArrayData **)((long)&local_e0.d.d + lVar15),2,8);
      }
    }
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  sequenceIndex = 0;
  do {
    pSVar12 = (SequenceEditor *)operator_new(0x50);
    SequenceEditor::SequenceEditor(pSVar12,mod,sequenceIndex,(QWidget *)0x0);
    (this->mSequenceEditors)._M_elems[sequenceIndex] = pSVar12;
    sequenceIndex = sequenceIndex + 1;
  } while (sequenceIndex != 4);
  pQVar11 = (QWidget *)this->mSequenceTabs;
  pSVar12 = (this->mSequenceEditors)._M_elems[0];
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52e8);
  QTabWidget::addTab(pQVar11,(QString *)pSVar12);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar11 = (QWidget *)this->mSequenceTabs;
  pSVar12 = (this->mSequenceEditors)._M_elems[1];
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52f1);
  QTabWidget::addTab(pQVar11,(QString *)pSVar12);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar11 = (QWidget *)this->mSequenceTabs;
  pSVar12 = (this->mSequenceEditors)._M_elems[2];
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b52f9);
  QTabWidget::addTab(pQVar11,(QString *)pSVar12);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar11 = (QWidget *)this->mSequenceTabs;
  pSVar12 = (this->mSequenceEditors)._M_elems[3];
  QMetaObject::tr((char *)&local_e0,(char *)&staticMetaObject,0x1b5315);
  QTabWidget::addTab(pQVar11,(QString *)pSVar12);
  if (&(local_e0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e0.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar6 = this->mSetEnvelopeCheck;
  local_e0.d.d = (Data *)QAbstractButton::toggled;
  local_e0.d.ptr = (char16_t *)0x0;
  puVar13 = (undefined4 *)operator_new(0x18);
  *puVar13 = 1;
  *(code **)(puVar13 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:114:9),_1,_QtPrivate::List<bool>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar13 + 4) = this;
  QObject::connectImpl
            (local_40,(void **)pQVar6,(QObject *)&local_e0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar13,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar5 = *local_68;
  local_e0.d.d = (Data *)QComboBox::currentIndexChanged;
  local_e0.d.ptr = (char16_t *)0x0;
  puVar13 = (undefined4 *)operator_new(0x18);
  *puVar13 = 1;
  *(code **)(puVar13 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:121:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar13 + 4) = this;
  QObject::connectImpl
            (local_48,(void **)pQVar5,(QObject *)&local_e0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar13,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar5 = this->mWaveformCombo;
  local_e0.d.d = (Data *)QComboBox::currentIndexChanged;
  local_e0.d.ptr = (char16_t *)0x0;
  local_80.d = (Data *)setEnvelopeToWaveform;
  local_80.ptr = (QString *)0x0;
  puVar13 = (undefined4 *)operator_new(0x20);
  *puVar13 = 1;
  *(code **)(puVar13 + 2) =
       QtPrivate::QSlotObject<void_(InstrumentEditor::*)(int),_QtPrivate::List<int>,_void>::impl;
  *(code **)(puVar13 + 4) = setEnvelopeToWaveform;
  *(undefined8 *)(puVar13 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar5,(QObject *)&local_e0,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar13,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  pQVar10 = this->mWaveformEditButton;
  local_e0.d.d = (Data *)QAbstractButton::clicked;
  local_e0.d.ptr = (char16_t *)0x0;
  puVar13 = (undefined4 *)operator_new(0x18);
  *puVar13 = 1;
  *(code **)(puVar13 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/forms/editors/InstrumentEditor.cpp:158:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(InstrumentEditor **)(puVar13 + 4) = this;
  QObject::connectImpl
            (local_58,(void **)pQVar10,(QObject *)&local_e0,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar13,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pEVar8 = this->mEnvelopeForm;
  local_e0.d.d = (Data *)EnvelopeForm::envelopeChanged;
  local_e0.d.ptr = (char16_t *)0x0;
  local_80.d = (Data *)setEnvelope;
  local_80.ptr = (QString *)0x0;
  puVar13 = (undefined4 *)operator_new(0x20);
  *puVar13 = 1;
  *(code **)(puVar13 + 2) =
       QtPrivate::
       QSlotObject<void_(InstrumentEditor::*)(unsigned_char),_QtPrivate::List<unsigned_char>,_void>
       ::impl;
  *(code **)(puVar13 + 4) = setEnvelope;
  *(undefined8 *)(puVar13 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pEVar8,(QObject *)&local_e0,(void **)this,
             (QSlotObjectBase *)&local_80,(ConnectionType)puVar13,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  return;
}

Assistant:

InstrumentEditor::InstrumentEditor(
    Module &mod,
    InstrumentListModel &model,
    WaveListModel &waveListModel,
    PianoInput const& input,
    QWidget *parent
) :
    BaseEditor(model, input, parent),
    mModule(mod),
    mWaveListModel(waveListModel),
    mChannelCombo(nullptr),
    mSetEnvelopeCheck(nullptr),
    mEnvelopeGroup(nullptr),
    mEnvelopeForm(nullptr),
    mWaveformGroup(nullptr),
    mWaveformCombo(nullptr),
    mWaveformEditButton(nullptr),
    mSequenceTabs(nullptr),
    mSequenceEditors(),
    mInstrument(nullptr),
    mCanEdit(true)
{
    setWindowTitle(tr("Instrument editor"));
    auto channelGroup = new QGroupBox(tr("Channel"));
    {
        auto layout = new QVBoxLayout;
        mChannelCombo = new QComboBox;
        mSetEnvelopeCheck = new QCheckBox(tr(TU::SET_VOLUME_CHECK_STR));
        layout->addWidget(mChannelCombo);
        layout->addWidget(mSetEnvelopeCheck);
        layout->addStretch();
        channelGroup->setLayout(layout);
    }

    mEnvelopeGroup = new QGroupBox(tr("Volume envelope"));
    {
        auto layout = new QVBoxLayout;
        mEnvelopeForm = new EnvelopeForm;
        layout->addWidget(mEnvelopeForm);
        layout->addStretch();
        layout->setContentsMargins(0, 0, 0, 0);
        mEnvelopeGroup->setLayout(layout);
    }

    mWaveformGroup = new QGroupBox(tr("Waveform"));
    {
        auto layout = new QHBoxLayout;
        mWaveformCombo = new QComboBox;
        mWaveformCombo->setModel(&mWaveListModel);
        mWaveformEditButton = new QPushButton(tr("Edit"));
        mWaveformEditButton->setAutoDefault(false);
        mWaveformEditButton->setDefault(false);
        layout->addWidget(mWaveformCombo, 1);
        layout->addWidget(mWaveformEditButton);
        layout->setAlignment(Qt::AlignTop);
        mWaveformGroup->setLayout(layout);

        
    }

    mSequenceTabs = new QTabWidget;

    auto layout = new QVBoxLayout;
    auto settingsLayout = new QHBoxLayout;
    settingsLayout->addWidget(channelGroup);
    settingsLayout->addWidget(mEnvelopeGroup, 1);
    settingsLayout->addWidget(mWaveformGroup, 1);
    layout->addLayout(settingsLayout);
    layout->addWidget(mSequenceTabs, 1);
    layout->setContentsMargins(0, 0, 0, 0);
    editorWidget()->setLayout(layout);
    
    mWaveformGroup->hide();
    mWaveformGroup->setEnabled(false);
    mEnvelopeGroup->setEnabled(false);
    
    mChannelCombo->addItems({
        tr("CH1 - Duty"),
        tr("CH2 - Duty"),
        tr("CH3 - Wave"),
        tr("CH4 - Noise")
    });

    for (size_t i = 0; i < trackerboy::Instrument::SEQUENCE_COUNT; ++i) {
        mSequenceEditors[i] = new SequenceEditor(mod, i);
    }
    

    mSequenceTabs->addTab(mSequenceEditors[0], tr("Arpeggio"));
    mSequenceTabs->addTab(mSequenceEditors[1], tr("Panning"));
    mSequenceTabs->addTab(mSequenceEditors[2], tr("Pitch"));
    mSequenceTabs->addTab(mSequenceEditors[3], tr(TU::DUTY_CYCLE_STR));
    

    connect(mSetEnvelopeCheck, &QCheckBox::toggled, this,
        [this](bool checked) {
            mEnvelopeGroup->setEnabled(checked);
            mWaveformGroup->setEnabled(checked);
            setEnvelopeEnable(checked);
        });

    connect(mChannelCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index == -1) {
                return;
            }
            setChannel(index);
            
            auto const isWave = index == 2;
            mWaveformGroup->setVisible(isWave);
            mEnvelopeGroup->setVisible(!isWave);

            switch (index) {
                case 0:
                case 1:
                    mSequenceTabs->setTabText(3, tr(TU::DUTY_CYCLE_STR));
                    break;
                case 2:
                    mSequenceTabs->setTabText(3, tr("Volume"));
                    break;
                case 3:
                    mSequenceTabs->setTabText(3, tr("Noise"));
                    break;
            }

            if (isWave) {
                setEnvelopeToWaveform(mWaveformCombo->currentIndex());
                mSetEnvelopeCheck->setText(tr(TU::SET_WAVE_CHECK_STR));
            } else {
                setEnvelope(mEnvelopeForm->envelope());
                mSetEnvelopeCheck->setText(tr(TU::SET_VOLUME_CHECK_STR));
            }

        });

    
    connect(mWaveformCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &InstrumentEditor::setEnvelopeToWaveform);

    connect(mWaveformEditButton, &QPushButton::clicked, this,
        [this]() {
            emit openWaveEditor(mWaveformCombo->currentIndex());
        });

    connect(mEnvelopeForm, &EnvelopeForm::envelopeChanged, this, &InstrumentEditor::setEnvelope);

}